

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int __thiscall CVmObjString::equals(CVmObjString *this,vm_obj_id_t self,vm_val_t *val,int param_3)

{
  int iVar1;
  
  if ((val->typ == VM_OBJ) && ((val->val).obj == self)) {
    return 1;
  }
  iVar1 = const_equals((this->super_CVmObject).ext_,val);
  return iVar1;
}

Assistant:

int CVmObjString::equals(VMG_ vm_obj_id_t self,
                         const vm_val_t *val, int /*depth*/) const
{
    /* if the other value is a reference to myself, we certainly match */
    if (val->typ == VM_OBJ && val->val.obj == self)
        return TRUE;

    /* 
     *   use the constant string comparison routine, using our underlying
     *   string as the constant string data 
     */
    return const_equals(vmg_ ext_, val);
}